

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O3

bool __thiscall ON_UuidList::Read(ON_UuidList *this,ON_BinaryArchive *archive,bool bSortAferRead)

{
  bool bVar1;
  bool bVar2;
  int major_version;
  int minor_version;
  int local_30 [2];
  
  bVar2 = false;
  (this->super_ON_SimpleArray<ON_UUID_struct>).m_count = 0;
  this->m_sorted_count = 0;
  this->m_removed_count = 0;
  local_30[0] = 0;
  local_30[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_30,local_30 + 1);
  if (bVar1) {
    if (local_30[0] == 1) {
      bVar1 = ON_BinaryArchive::ReadArray(archive,&this->super_ON_SimpleArray<ON_UUID_struct>);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  if (bSortAferRead) {
    SortHelper(this);
  }
  else {
    PurgeHelper(this);
  }
  return bVar2;
}

Assistant:

bool ON_UuidList::Read( 
    class ON_BinaryArchive& archive,
    bool bSortAferRead
    )
{
  // NOTE:
  // Per bug 101403, this function is called with
  // bSortAferRead = false when reading ON_HistoryRecord::m_descendants[].
  // All other used call this function with bSortAferRead = true.
  m_count = 0;
  m_removed_count = 0;
  m_sorted_count = 0;
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, 
                                       &major_version, 
                                       &minor_version );
  if (rc)
  {
    if ( 1 != major_version )
      rc = false;

    if (rc)
      rc = archive.ReadArray( *this );

    if ( !archive.EndRead3dmChunk() )
      rc = false;
  }

  if ( bSortAferRead )
  {
    // clean and sort
    SortHelper();
  }
  else
  {
    // clean
    PurgeHelper();
  }

  return rc;
}